

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<unsigned_long_long>
tcb::operator/(rational<unsigned_long_long> *lhs,rational<unsigned_long_long> *rhs)

{
  rational<unsigned_long_long> rVar1;
  rational<unsigned_long_long> local_18;
  
  local_18.num_ = rhs->denom_ * lhs->num_;
  local_18.denom_ = rhs->num_ * lhs->denom_;
  rational<unsigned_long_long>::simplify(&local_18);
  rVar1.denom_ = local_18.denom_;
  rVar1.num_ = local_18.num_;
  return rVar1;
}

Assistant:

constexpr value_type denom() const { return denom_; }